

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asc2log.c
# Opt level: O3

int main(int argc,char **argv)

{
  __time_t _Var1;
  unsigned_long_long uVar2;
  undefined5 uVar3;
  undefined2 uVar4;
  undefined8 uVar5;
  uchar dlc_00;
  byte bVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  FILE *__stream;
  FILE *pFVar10;
  size_t sVar11;
  char timestamps;
  char cVar12;
  undefined1 *puVar13;
  cu_t *cf;
  ulong uVar14;
  long lVar15;
  timeval *tv;
  char *pcVar16;
  char cVar17;
  int dplace;
  int *piVar18;
  FILE *outfile;
  uint uVar19;
  char *pcVar20;
  bool bVar21;
  char rtr;
  uchar secbit;
  uchar vcid;
  uchar sdt;
  int interface;
  uint local_2260;
  int dlc;
  int n;
  int dlen_1;
  uchar brs;
  FILE *local_2248;
  char *local_2240;
  char dir_1 [5];
  unsigned_long_long sec_1;
  uchar esi;
  char dir [5];
  int n_1;
  char tmp1 [10];
  int dlc_2;
  char tmp2 [10];
  int data [8];
  char idstr [21];
  unsigned_long_long sec;
  int interface_2;
  unsigned_long_long usec;
  tm tms;
  char buf [6500];
  
  pFVar10 = _stdout;
  __stream = _stdin;
LAB_00101400:
  do {
    while (local_2248 = pFVar10, iVar8 = getopt(argc,argv,"I:O:dv?"), iVar8 < 0x4f) {
      if (iVar8 == -1) {
        pcVar16 = fgets(buf,0x1963,__stream);
        if (pcVar16 == (char *)0x0) goto LAB_00102269;
        goto LAB_001014c9;
      }
      if (iVar8 != 0x49) {
        if (iVar8 == 0x3f) {
          pcVar16 = __xpg_basename(*argv);
          print_usage(pcVar16);
          return 0;
        }
        goto LAB_001022b8;
      }
      __stream = fopen(_optarg,"r");
      pFVar10 = local_2248;
      if (__stream == (FILE *)0x0) {
        pcVar16 = "infile";
LAB_001022f3:
        perror(pcVar16);
        return 1;
      }
    }
    puVar13 = &main_disable_dir;
    if (iVar8 != 100) {
      if (iVar8 != 0x76) {
        if (iVar8 != 0x4f) {
LAB_001022b8:
          main_cold_3();
          return 1;
        }
        pFVar10 = fopen(_optarg,"w");
        if (pFVar10 == (FILE *)0x0) {
          pcVar16 = "outfile";
          goto LAB_001022f3;
        }
        goto LAB_00101400;
      }
      puVar13 = &main_verbose;
    }
    *puVar13 = 1;
    pFVar10 = local_2248;
  } while( true );
LAB_001014c9:
  pcVar16 = buf + 9;
  if (main::dplace == 0) {
    if ((main::base == '\0') &&
       (iVar8 = __isoc99_sscanf(buf,"base %9s timestamps %9s",tmp1,tmp2), iVar8 == 2)) {
      main::base = tmp1[0];
      main::timestamps = tmp2[0];
      if (main_verbose == '\x01') {
        printf("base %c timestamps %c\n",(ulong)(uint)(int)tmp1[0]);
      }
      if ((main::base != 'd') && (main::base != 'h')) {
        pcVar20 = "invalid base %s (must be \'hex\' or \'dez\')!\n";
        pcVar16 = tmp1;
LAB_001022de:
        printf(pcVar20,pcVar16);
        return 1;
      }
      uVar5 = eval_canxl_xl_read_tv._0_8_;
      if ((main::timestamps != 'a') && (main::timestamps != 'r')) {
        pcVar20 = "invalid timestamps %s (must be \'absolute\' or \'relative\')!\n";
        pcVar16 = tmp2;
        goto LAB_001022de;
      }
    }
    else if ((main::date_tv.tv_sec == 0) && (buf._0_4_ == 0x65746164)) {
      data[0] = 0;
      pcVar20 = strcasestr(pcVar16," am ");
      if ((pcVar20 == (char *)0x0) && (pcVar20 = strcasestr(pcVar16," pm "), pcVar20 == (char *)0x0)
         ) {
        pcVar20 = setlocale(2,"de_DE");
        if (pcVar20 == (char *)0x0) goto LAB_00101e6c;
        pcVar20 = strptime(pcVar16,"%B %d %H:%M:%S %Y",(tm *)&tms);
        if (pcVar20 == (char *)0x0) {
          pcVar20 = "%B %d %H:%M:%S.%Y %Y";
LAB_001018e4:
          pcVar20 = strptime(pcVar16,pcVar20,(tm *)&tms);
          if (pcVar20 != (char *)0x0) {
            __isoc99_sscanf(pcVar16,"%*s %*d %*d:%*d:%*d.%3u ",data);
            goto LAB_00101916;
          }
          goto LAB_00101e71;
        }
LAB_00101916:
        main::date_tv.tv_sec = mktime((tm *)&tms);
        main::date_tv.tv_usec = (__suseconds_t)(uint)(data[0] * 1000);
        if (main::date_tv.tv_sec < 0) goto LAB_00101e71;
      }
      else {
        pcVar20 = setlocale(2,"en_US");
        if (pcVar20 != (char *)0x0) {
          pcVar20 = strptime(pcVar16,"%B %d %I:%M:%S %p %Y",(tm *)&tms);
          if (pcVar20 == (char *)0x0) {
            pcVar20 = "%B %d %I:%M:%S.%Y %p %Y";
            goto LAB_001018e4;
          }
          goto LAB_00101916;
        }
LAB_00101e6c:
        main_cold_1();
LAB_00101e71:
        main_cold_2();
      }
      _Var1 = main::date_tv.tv_sec;
      uVar5 = eval_canxl_xl_read_tv._0_8_;
      if (main_verbose == '\x01') {
        pcVar16 = ctime(&main::date_tv.tv_sec);
        printf("date %llu => %s",_Var1,pcVar16);
        uVar5 = eval_canxl_xl_read_tv._0_8_;
      }
    }
    else {
      iVar8 = __isoc99_sscanf(buf,"%llu.%9s %9s ",&sec,tmp2,tmp1);
      uVar5 = eval_canxl_xl_read_tv._0_8_;
      if (iVar8 == 3) {
        sVar11 = strlen(tmp2);
        main::dplace = (int)sVar11;
        if (main_verbose == '\x01') {
          printf("decimal place %d, e.g. \'%s\'\n",sVar11 & 0xffffffff,tmp2);
        }
        if (main::dplace - 7U < 0xfffffffd) {
          printf("invalid dplace %d (must be 4, 5 or 6)!\n",(ulong)(uint)main::dplace);
          return 1;
        }
        goto LAB_001014d6;
      }
    }
  }
  else {
LAB_001014d6:
    iVar9 = __isoc99_sscanf(buf,"%llu.%llu %9s ",&sec,&usec,tmp1);
    cVar12 = main::timestamps;
    cVar17 = main::base;
    iVar8 = main::dplace;
    bVar6 = main_disable_dir;
    uVar5 = eval_canxl_xl_read_tv._0_8_;
    if (iVar9 == 3) {
      timestamps = (char)main::dplace;
      if (tmp1[4] == 'L' && tmp1._0_4_ == 0x584e4143) {
        uVar19 = (uint)main_disable_dir;
        outfile = (FILE *)&dlc;
        iVar9 = __isoc99_sscanf(buf,"%llu.%llu %*s %d %4s %4s ",dir_1,dir,&interface_2,outfile,&rtr)
        ;
        uVar5 = eval_canxl_xl_read_tv._0_8_;
        if (((iVar9 == 5) &&
            (sVar11 = strlen((char *)&dlc), uVar5 = eval_canxl_xl_read_tv._0_8_, sVar11 == 2)) &&
           (sVar11 = strlen(&rtr), uVar5 = eval_canxl_xl_read_tv._0_8_, sVar11 == 4)) {
          if (_rtr == 0x46464c58) {
            memset(&tms,0,0x80c);
            dlen_1 = 0;
            n_1 = 0;
            piVar18 = &n;
            iVar9 = __isoc99_sscanf(buf,
                                    "%llu.%llu %*s %d %4s %*s %*s %*s %20s %hhx %hhx %x %d %*s %*s %hhx %x %n"
                                    ,idstr,&sec_1,piVar18,&interface,data,&sdt,&secbit,&dlc_2,
                                    &dlen_1,&vcid,&brs,&n_1);
            if (iVar9 != 0xb) {
              piVar18 = &n;
              iVar9 = __isoc99_sscanf(buf,
                                      "%llu.%llu %*s %d %4s %*s %*s %*s %20s %*s %hhx %hhx %x %d %*s %*s %hhx %x %n"
                                      ,idstr,&sec_1,piVar18,&interface,data,&sdt,&secbit,&dlc_2,
                                      &dlen_1,&vcid,&brs,&n_1);
              uVar5 = eval_canxl_xl_read_tv._0_8_;
              if (iVar9 != 0xb) goto LAB_00101dff;
            }
            uVar2 = sec_1;
            uVar5._0_1_ = idstr[0];
            uVar5._1_1_ = idstr[1];
            uVar5._2_1_ = idstr[2];
            uVar5._3_1_ = idstr[3];
            uVar5._4_1_ = idstr[4];
            uVar5._5_1_ = idstr[5];
            uVar5._6_1_ = idstr[6];
            uVar5._7_1_ = idstr[7];
            eval_canxl_xl_read_tv[0] = idstr[0];
            eval_canxl_xl_read_tv[1] = idstr[1];
            eval_canxl_xl_read_tv[2] = idstr[2];
            eval_canxl_xl_read_tv[3] = idstr[3];
            eval_canxl_xl_read_tv[4] = idstr[4];
            eval_canxl_xl_read_tv[5] = idstr[5];
            eval_canxl_xl_read_tv[6] = idstr[6];
            eval_canxl_xl_read_tv[7] = idstr[7];
            eval_canxl_xl_read_tv._8_8_ = sec_1;
            if (((dlen_1 < 0x801) && (uVar5 = eval_canxl_xl_read_tv._0_8_, dlc_2 < 0x800)) &&
               (secbit < 2)) {
              tms.tm_min._1_1_ = sdt;
              tms.tm_hour = _brs;
              local_2260 = dlc_2;
              local_2240 = (char *)CONCAT44(local_2240._4_4_,dlen_1);
              sVar11 = strlen((char *)&interface);
              uVar5 = eval_canxl_xl_read_tv._0_8_;
              if (sVar11 == 2) {
                if (uVar19 != 0) {
                  interface = CONCAT31(interface._1_3_,0x2e);
                }
                if ((iVar8 != 4 || (long)uVar2 < 0x147ae14) &&
                   ((int)local_2240 == local_2260 + 1 && ((long)uVar2 < 0xccccccc || iVar8 != 5))) {
                  get_can_id((canid_t *)&tms,(char *)data,0x10);
                  iVar8 = (int)piVar18;
                  uVar5 = eval_canxl_xl_read_tv._0_8_;
                  if ((uint)tms.tm_sec < 0x800) {
                    if (vcid != '\0') {
                      tms.tm_sec = (uint)vcid << 0x10 | tms.tm_sec;
                    }
                    pcVar16 = buf + n_1;
                    tms.tm_min._2_2_ = (short)dlen_1;
                    if (0 < dlen_1) {
                      lVar15 = 0;
                      do {
                        local_2240 = pcVar16;
                        bVar6 = asc2nibble(*pcVar16);
                        uVar5 = eval_canxl_xl_read_tv._0_8_;
                        if (0xf < bVar6) goto LAB_00101dff;
                        bVar7 = asc2nibble(local_2240[1]);
                        iVar8 = (int)piVar18;
                        uVar5 = eval_canxl_xl_read_tv._0_8_;
                        if (0xf < bVar7) goto LAB_00101dff;
                        *(byte *)((long)&tms.tm_mday + lVar15) = bVar7 | bVar6 << 4;
                        pcVar16 = local_2240 + 3;
                        lVar15 = lVar15 + 1;
                      } while (lVar15 < dlen_1);
                    }
                    iVar9 = __isoc99_sscanf(pcVar16,"%*x %x ",&esi);
                    uVar5 = eval_canxl_xl_read_tv._0_8_;
                    if ((iVar9 == 1) && ((_esi >> 0x16 & 1) != 0)) {
                      tms.tm_min._0_1_ = (byte)(_esi >> 0x16) & 2 | (_esi >> 0x18 & 1) == 0 ^ 0x81U;
                      calc_tv((timeval *)&eval_canxl_xl_tv,(timeval *)eval_canxl_xl_read_tv,
                              (timeval *)(ulong)(uint)(int)cVar12,timestamps,iVar8);
                      cf = (cu_t *)(ulong)(uint)n;
                      iVar8 = (int)DAT_00107198;
                      cVar17 = (char)&tms;
                      tv = eval_canxl_xl_tv;
                      goto LAB_00101de0;
                    }
                  }
                }
              }
            }
          }
          else if ((_rtr == 0x46464246) || (_rtr == 0x46464546)) {
            eval_canxl_fd(buf,(timeval *)(ulong)(uint)(int)cVar12,timestamps,uVar19,(int)local_2248,
                          outfile);
            uVar5 = eval_canxl_xl_read_tv._0_8_;
          }
          else if ((_rtr == 0x46464243) || (_rtr == 0x46464543)) {
            eval_canxl_cc(buf,(timeval *)(ulong)(uint)(int)cVar12,timestamps,uVar19,(int)local_2248,
                          outfile);
            uVar5 = eval_canxl_xl_read_tv._0_8_;
          }
        }
      }
      else if (tmp1[4] == 'D' && tmp1._0_4_ == 0x464e4143) {
        local_2240 = (char *)CONCAT71(local_2240._1_7_,main::timestamps);
        tms.tm_zone = (char *)0x0;
        tms.tm_isdst = 0;
        tms._36_4_ = 0;
        tms.tm_gmtoff = 0;
        tms.tm_mon = 0;
        tms.tm_year = 0;
        tms.tm_wday = 0;
        tms.tm_yday = 0;
        tms.tm_sec = 0;
        tms.tm_min = 0;
        tms.tm_hour = 0;
        tms.tm_mday = 0;
        _rtr = 0;
        n = 0;
        pcVar16 = dir;
        iVar9 = __isoc99_sscanf(buf,"%llu.%llu %*s %d %4s %20s %hhx %hhx %x %d %n",idstr,&sec_1,
                                pcVar16,dir_1,data,&brs,&esi,&dlc,&rtr,&n);
        if (iVar9 != 9) {
          pcVar16 = dir;
          iVar9 = __isoc99_sscanf(buf,"%llu.%llu %*s %d %4s %20s %*s %hhx %hhx %x %d %n",idstr,
                                  &sec_1,pcVar16,dir_1,data,&brs,&esi,&dlc,&rtr,&n);
          uVar5 = eval_canxl_xl_read_tv._0_8_;
          if (iVar9 != 9) goto LAB_00101dff;
        }
        uVar2 = sec_1;
        uVar19 = _rtr;
        eval_canfd_read_tv[0] = idstr[0];
        eval_canfd_read_tv[1] = idstr[1];
        eval_canfd_read_tv[2] = idstr[2];
        eval_canfd_read_tv[3] = idstr[3];
        eval_canfd_read_tv[4] = idstr[4];
        eval_canfd_read_tv[5] = idstr[5];
        eval_canfd_read_tv[6] = idstr[6];
        eval_canfd_read_tv[7] = idstr[7];
        eval_canfd_read_tv._8_8_ = sec_1;
        uVar5 = eval_canxl_xl_read_tv._0_8_;
        if (((((int)_rtr < 0x41) && (dlc < 0x10)) && (brs < 2)) &&
           ((esi < 2 && (sVar11 = strlen(dir_1), uVar5 = eval_canxl_xl_read_tv._0_8_, sVar11 == 2)))
           ) {
          if ((bVar6 & 1) != 0) {
            dir_1[0] = '.';
          }
          if ((iVar8 != 4 || (long)uVar2 < 0x147ae14) && (iVar8 != 5 || (long)uVar2 < 0xccccccc)) {
            dlc_00 = can_fd_len2dlc((uchar)uVar19);
            bVar6 = can_fd_dlc2len(dlc_00);
            uVar5 = eval_canxl_xl_read_tv._0_8_;
            if (uVar19 != bVar6) goto LAB_00101dff;
            get_can_id((canid_t *)&tms,(char *)data,0x10);
            iVar8 = (int)pcVar16;
            pcVar20 = buf + n;
            tms.tm_min._0_1_ = (char)_rtr;
            local_2260 = _rtr;
            if (0 < (int)_rtr) {
              lVar15 = 0;
              do {
                bVar6 = asc2nibble(*pcVar20);
                uVar5 = eval_canxl_xl_read_tv._0_8_;
                if (0xf < bVar6) goto LAB_00101dff;
                bVar7 = asc2nibble(pcVar20[1]);
                iVar8 = (int)pcVar16;
                uVar5 = eval_canxl_xl_read_tv._0_8_;
                if (0xf < bVar7) goto LAB_00101dff;
                *(byte *)((long)&tms.tm_hour + lVar15) = bVar7 | bVar6 << 4;
                pcVar20 = pcVar20 + 3;
                lVar15 = lVar15 + 1;
              } while (lVar15 < (int)_rtr);
            }
            iVar9 = __isoc99_sscanf(pcVar20,"   %*x %*x %x ",&interface);
            uVar5 = eval_canxl_xl_read_tv._0_8_;
            if (iVar9 != 1) goto LAB_00101dff;
            if (((uint)interface >> 0xc & 1) == 0) {
              cVar12 = (char)local_2260;
              if ((interface & 0x10U) != 0) {
                iVar9 = 8;
                if (dlc < 8) {
                  iVar9 = dlc;
                }
                cVar12 = (char)iVar9;
                tms._0_8_ = CONCAT35(tms.tm_min._1_3_,CONCAT14(cVar12,tms.tm_sec)) | 0x40000000;
              }
              cVar17 = (char)&tms;
              if (dlc - 9U < 7 && cVar12 == '\b') {
                tms.tm_min._3_1_ = (char)dlc;
              }
            }
            else {
              bVar21 = ((uint)interface >> 0xd & 1) == 0;
              uVar4 = tms.tm_min._2_2_;
              uVar3 = tms._0_5_;
              tms._0_8_ = CONCAT26(tms.tm_min._2_2_,CONCAT15(bVar21,tms._0_5_)) ^ 0x50000000000;
              cVar17 = (char)&tms;
              if (((uint)interface >> 0xe & 1) != 0) {
                tms._0_8_ = CONCAT26(uVar4,CONCAT15(bVar21,uVar3)) ^ 0x50000000000 | 0x20000000000;
              }
            }
            calc_tv((timeval *)&eval_canfd_tv,(timeval *)eval_canfd_read_tv,
                    (timeval *)(ulong)(uint)(int)(char)local_2240,timestamps,iVar8);
            iVar8 = (int)DAT_00108b60;
            tv = eval_canfd_tv;
            uVar19 = dir._0_4_;
LAB_001021f9:
            cf = (cu_t *)(ulong)uVar19;
            goto LAB_00101de0;
          }
        }
      }
      else {
        tms.tm_zone = (char *)0x0;
        tms.tm_isdst = 0;
        tms._36_4_ = 0;
        tms.tm_gmtoff = 0;
        tms.tm_mon = 0;
        tms.tm_year = 0;
        tms.tm_wday = 0;
        tms.tm_yday = 0;
        tms.tm_sec = 0;
        tms.tm_min = 0;
        tms.tm_hour = 0;
        tms.tm_mday = 0;
        dlc = 0;
        piVar18 = &interface;
        iVar9 = __isoc99_sscanf(buf,"%llu.%llu %d %20s",&sec_1,dir_1,piVar18,idstr);
        if (iVar9 == 4) {
          eval_can_read_tv._0_8_ = sec_1;
          eval_can_read_tv._9_7_ = stack0xffffffffffffddc9;
          eval_can_read_tv[8] = dir_1[0];
          if (idstr._8_2_ != 0x656d || idstr._0_8_ != 0x617246726f727245) goto LAB_001015fe;
          tms._0_5_ = 0x820000080;
          calc_tv((timeval *)&eval_can_tv,(timeval *)eval_can_read_tv,
                  (timeval *)(ulong)(uint)(int)cVar12,timestamps,(int)piVar18);
          cf = (cu_t *)(ulong)(uint)interface;
          iVar8 = (int)DAT_00108b80;
          cVar17 = (char)&tms;
          tv = eval_can_tv;
LAB_00101de0:
          pFVar10 = local_2248;
          prframe((FILE *)local_2248,tv,iVar8,cf,cVar17);
          fflush(pFVar10);
          uVar5 = eval_canxl_xl_read_tv._0_8_;
        }
        else {
LAB_001015fe:
          local_2260 = iVar8;
          local_2240 = (char *)CONCAT71(local_2240._1_7_,cVar12);
          pcVar16 = "%llu.%llu %d %20s %4s %c %x %d %d %d %d %d %d %d %d";
          if (cVar17 == 'h') {
            pcVar16 = "%llu.%llu %d %20s %4s %c %x %x %x %x %x %x %x %x %x";
          }
          piVar18 = &interface;
          iVar9 = __isoc99_sscanf(buf,pcVar16,&sec_1,dir_1,piVar18,idstr,dir,&rtr,&dlc,data,data + 1
                                  ,data + 2,data + 3,data + 4,data + 5,data + 6,data + 7);
          iVar8 = dlc;
          dplace = (int)piVar18;
          eval_can_read_tv._0_8_ = sec_1;
          eval_can_read_tv._9_7_ = stack0xffffffffffffddc9;
          eval_can_read_tv[8] = dir_1[0];
          uVar5 = eval_canxl_xl_read_tv._0_8_;
          if ((6 < iVar9) && (dlc < 0x10)) {
            uVar19 = 8;
            if (dlc < 8) {
              uVar19 = dlc;
            }
            if ((iVar9 == uVar19 + 7) || ((iVar9 == 7 && (rtr == 'r')))) {
              iVar9 = 10;
              if (cVar17 == 'h') {
                iVar9 = 0x10;
              }
              get_can_id((canid_t *)&tms,idstr,iVar9);
              if (8 < dlc) {
                tms.tm_min._3_1_ = (char)dlc;
              }
              sVar11 = strlen(dir);
              uVar5 = eval_canxl_xl_read_tv._0_8_;
              if (sVar11 == 2) {
                if ((bVar6 & 1) != 0) {
                  dir[0] = '.';
                }
                if ((local_2260 != 4 || (long)eval_can_read_tv._8_8_ < 0x147ae14) &&
                   (local_2260 != 5 || (long)eval_can_read_tv._8_8_ < 0xccccccc)) {
                  tms.tm_min._0_1_ = (char)uVar19;
                  if (rtr == 'r') {
                    tms._0_8_ = CONCAT44(tms.tm_min,tms.tm_sec) | 0x40000000;
                  }
                  else if (0 < iVar8) {
                    uVar14 = 0;
                    do {
                      *(char *)((long)&tms.tm_hour + uVar14) = (char)data[uVar14];
                      uVar14 = uVar14 + 1;
                    } while (uVar19 != uVar14);
                  }
                  cVar17 = (char)&tms;
                  calc_tv((timeval *)&eval_can_tv,(timeval *)eval_can_read_tv,
                          (timeval *)(ulong)(uint)(int)(char)local_2240,(char)local_2260,dplace);
                  iVar8 = (int)DAT_00108b80;
                  tv = eval_can_tv;
                  uVar19 = interface;
                  goto LAB_001021f9;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00101dff:
  eval_canxl_xl_read_tv._0_8_ = uVar5;
  pcVar16 = fgets(buf,0x1963,__stream);
  if (pcVar16 == (char *)0x0) {
LAB_00102269:
    fclose(local_2248);
    fclose(__stream);
    return 0;
  }
  goto LAB_001014c9;
}

Assistant:

int main(int argc, char **argv)
{
	char buf[BUFLEN], tmp1[10], tmp2[10];

	FILE *infile = stdin;
	FILE *outfile = stdout;
	static int verbose, disable_dir;
	static struct timeval date_tv; /* date of the ASC file */
	static int dplace; /* decimal place 4, 5 or 6 or uninitialized */
	static char base; /* 'd'ec or 'h'ex */
	static char timestamps; /* 'a'bsolute or 'r'elative */
	int opt;
	unsigned long long sec, usec;

	while ((opt = getopt(argc, argv, "I:O:dv?")) != -1) {
		switch (opt) {
		case 'I':
			infile = fopen(optarg, "r");
			if (!infile) {
				perror("infile");
				return 1;
			}
			break;

		case 'O':
			outfile = fopen(optarg, "w");
			if (!outfile) {
				perror("outfile");
				return 1;
			}
			break;

		case 'd':
			disable_dir = 1;
			break;

		case 'v':
			verbose = 1;
			break;

		case '?':
			print_usage(basename(argv[0]));
			return 0;
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			print_usage(basename(argv[0]));
			return 1;
			break;
		}
	}


	while (fgets(buf, BUFLEN-1, infile)) {

		if (!dplace) { /* the representation of a valid CAN frame not known */

			/* check for base and timestamp entries in the header */
			if ((!base) &&
			    (sscanf(buf, "base %9s timestamps %9s", tmp1, tmp2) == 2)) {
				base = tmp1[0];
				timestamps = tmp2[0];
				if (verbose)
					printf("base %c timestamps %c\n", base, timestamps);
				if ((base != 'h') && (base != 'd')) {
					printf("invalid base %s (must be 'hex' or 'dez')!\n",
					       tmp1);
					return 1;
				}
				if ((timestamps != 'a') && (timestamps != 'r')) {
					printf("invalid timestamps %s (must be 'absolute'"
					       " or 'relative')!\n", tmp2);
					return 1;
				}
				continue;
			}

			/* check for the original logging date in the header */ 
			if ((!date_tv.tv_sec) &&
			    (!strncmp(buf, "date", 4))) {

				if (get_date(&date_tv, &buf[9])) { /* skip 'date day ' */
					fprintf(stderr, "Not able to determine original log "
						"file date. Using current time.\n");
					/* use current date as default */
					gettimeofday(&date_tv, NULL);
				}
				if (verbose)
					printf("date %llu => %s", (unsigned long long)date_tv.tv_sec, ctime(&date_tv.tv_sec));
				continue;
			}

			/* check for decimal places length in valid CAN frames */
			if (sscanf(buf, "%llu.%9s %9s ", &sec, tmp2,
				   tmp1) != 3)
				continue; /* dplace remains zero until first found CAN frame */

			dplace = strlen(tmp2);
			if (verbose)
				printf("decimal place %d, e.g. '%s'\n", dplace,
				       tmp2);
			if (dplace < 4 || dplace > 6) {
				printf("invalid dplace %d (must be 4, 5 or 6)!\n",
				       dplace);
				return 1;
			}
		}

		/*
		 * The representation of a valid CAN frame is known here.
		 * So try to get CAN frames and ErrorFrames and convert them.
		 */

		/* check classic CAN format or the CANFD/CANXL tag which can take different types */
		if (sscanf(buf, "%llu.%llu %9s ", &sec,  &usec, tmp1) == 3) {
			if (!strncmp(tmp1, "CANXL", 5))
				eval_canxl(buf, &date_tv, timestamps, dplace, disable_dir, outfile);
			else if (!strncmp(tmp1, "CANFD", 5))
				eval_canfd(buf, &date_tv, timestamps, dplace, disable_dir, outfile);
			else
				eval_can(buf, &date_tv, timestamps, base, dplace, disable_dir, outfile);
		}
	}
	fclose(outfile);
	fclose(infile);
	return 0;
}